

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

string * __thiscall
cmGlobalGenerator::GenerateCMakeBuildCommand
          (string *__return_storage_ptr__,cmGlobalGenerator *this,string *target,string *config,
          string *native,bool ignoreErrors)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  undefined4 extraout_var;
  string local_50;
  
  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar3->_M_string_length);
  cmSystemTools::ConvertToOutputPath(&local_50,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if (config->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(config->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (target->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(target->_M_dataplus)._M_p);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  if (ignoreErrors) {
    iVar2 = (*this->_vptr_cmGlobalGenerator[0x33])();
    if (((char *)CONCAT44(extraout_var,iVar2) != (char *)0x0) &&
       (*(char *)CONCAT44(extraout_var,iVar2) != '\0')) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
  }
  if (native->_M_string_length != 0) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::_M_append
              ((char *)__return_storage_ptr__,(ulong)(native->_M_dataplus)._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalGenerator::GenerateCMakeBuildCommand(
  const std::string& target, const std::string& config,
  const std::string& native, bool ignoreErrors)
{
  std::string makeCommand = cmSystemTools::GetCMakeCommand();
  makeCommand = cmSystemTools::ConvertToOutputPath(makeCommand);
  makeCommand += " --build .";
  if (!config.empty()) {
    makeCommand += " --config \"";
    makeCommand += config;
    makeCommand += "\"";
  }
  if (!target.empty()) {
    makeCommand += " --target \"";
    makeCommand += target;
    makeCommand += "\"";
  }
  const char* sep = " -- ";
  if (ignoreErrors) {
    const char* iflag = this->GetBuildIgnoreErrorsFlag();
    if (iflag && *iflag) {
      makeCommand += sep;
      makeCommand += iflag;
      sep = " ";
    }
  }
  if (!native.empty()) {
    makeCommand += sep;
    makeCommand += native;
  }
  return makeCommand;
}